

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderSwitchTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderSwitchTests::makeSwitchCases
          (ShaderSwitchTests *this,string *name,string *desc,LineStream *switchBody)

{
  TestContext *pTVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  TestNode *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  LineStream *local_50;
  string *local_48;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
  local_40;
  
  lVar6 = 0;
  local_80 = (TestNode *)this;
  local_58 = desc;
  local_50 = switchBody;
  local_48 = name;
  do {
    pTVar1 = local_80->m_testCtx;
    local_c0[0] = local_b0;
    pcVar2 = (local_48->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar2,pcVar2 + local_48->_M_string_length);
    std::__cxx11::string::append((char *)local_c0);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_c0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    makeSwitchCase(&local_40,pTVar1,&local_a0,local_58,(SwitchType)lVar6,true,local_50);
    tcu::TestNode::addChild
              (local_80,(TestNode *)
                        local_40.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
                        .m_data.ptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    pTVar1 = local_80->m_testCtx;
    local_c0[0] = local_b0;
    pcVar2 = (local_48->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar2,pcVar2 + local_48->_M_string_length);
    std::__cxx11::string::append((char *)local_c0);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_c0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    makeSwitchCase(&local_40,pTVar1,&local_a0,local_58,(SwitchType)lVar6,false,local_50);
    tcu::TestNode::addChild
              (local_80,(TestNode *)
                        local_40.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
                        .m_data.ptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void ShaderSwitchTests::makeSwitchCases (const string& name, const string& desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_vertex"),	desc, (SwitchType)type, true,	switchBody).release());
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_fragment"),	desc, (SwitchType)type, false,	switchBody).release());
	}
}